

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListView::setRowHidden(QListView *this,int row,bool hide)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  Bucket BVar5;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this_00->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,&this_00->root);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,row,0,(QModelIndex *)&local_58);
  local_48.ptr = local_68.ptr;
  local_58 = local_78;
  puStack_50 = puStack_70;
  this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              **)(*(long *)(this_00->model + 8) + 0x90);
  if (this_01 !=
      (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *)
      0x0) {
    BVar5 = QHashPrivate::
            Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
            ::findBucket<QtPrivate::QModelIndexWrapper>(this_01,(QModelIndexWrapper *)&local_58);
    if ((BVar5.span[BVar5.index] != (Span)0xff) && (*(long *)(BVar5.span + 0x80) != 0)) {
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_58,(QModelIndex *)&local_78);
      this_02 = *(Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> **)
                 &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                  super_QWidgetPrivate.field_0x48;
      if (this_02 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
        bVar4 = false;
      }
      else {
        pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                 findNode<QPersistentModelIndex>(this_02,(QPersistentModelIndex *)&local_58);
        bVar4 = pNVar2 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
      }
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
      goto LAB_005689c6;
    }
  }
  bVar4 = false;
LAB_005689c6:
  lVar3 = 0x88;
  if ((!(bool)(!hide | bVar4)) || (lVar3 = 0x90, bVar4 && !hide)) {
    (**(code **)(**(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate + lVar3))();
  }
  QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
  QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::setRowHidden(int row, bool hide)
{
    Q_D(QListView);
    const bool hidden = d->isHidden(row);
    if (hide && !hidden)
        d->commonListView->appendHiddenRow(row);
    else if (!hide && hidden)
        d->commonListView->removeHiddenRow(row);
    d->doDelayedItemsLayout();
    d->viewport->update();
}